

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getTransitionMatrix
          (BeagleCPUImpl<float,_1,_0> *this,int matrixIndex,double *outMatrix)

{
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  int j;
  int i;
  float *offsetBeagleMatrix;
  double *offsetOutMatrix;
  int local_30;
  int local_2c;
  float *local_28;
  double *local_20;
  
  local_28 = *(float **)(*(long *)(in_RDI + 0xd0) + (long)in_ESI * 8);
  local_20 = in_RDX;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x34); local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < *(int *)(in_RDI + 0x24); local_30 = local_30 + 1) {
      beagleMemCpy<double,float>(local_20,local_28,*(uint *)(in_RDI + 0x24));
      local_28 = local_28 + *(int *)(in_RDI + 0x28);
      local_20 = local_20 + *(int *)(in_RDI + 0x24);
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getTransitionMatrix(int matrixIndex,
                                                 double* outMatrix) {
    // TODO Test with multiple rate categories
if (T_PAD != 0) {
    double* offsetOutMatrix = outMatrix;
    REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
    for(int i = 0; i < kCategoryCount; i++) {
        for(int j = 0; j < kStateCount; j++) {
            beagleMemCpy(offsetOutMatrix,offsetBeagleMatrix,kStateCount);
            offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
            offsetOutMatrix += kStateCount;
        }
    }
} else {
    beagleMemCpy(outMatrix,gTransitionMatrices[matrixIndex],
            kMatrixSize * kCategoryCount);
}
    return BEAGLE_SUCCESS;
}